

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O2

boundaries *
nlohmann::detail::dtoa_impl::compute_boundaries<double>
          (boundaries *__return_storage_ptr__,double value)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  diyfp dVar7;
  diyfp dVar8;
  
  uVar1 = (ulong)value & 0xfffffffffffff;
  bVar6 = (ulong)value >> 0x34 == 0;
  uVar4 = uVar1 | 0x10000000000000;
  if (bVar6) {
    uVar4 = uVar1;
  }
  iVar5 = -0x432;
  if (!bVar6) {
    iVar5 = (uint)((ulong)value >> 0x34) - 0x433;
  }
  bVar6 = (ulong)value >> 0x35 == 0;
  iVar2 = iVar5 + -2;
  if (bVar6 || uVar1 != 0) {
    iVar2 = iVar5 + -1;
  }
  lVar3 = uVar4 * 4;
  if (bVar6 || uVar1 != 0) {
    lVar3 = uVar4 * 2;
  }
  dVar7.e = iVar5 + -1;
  dVar7.f = uVar4 * 2 + 1;
  dVar7._12_4_ = 0;
  dVar7 = diyfp::normalize(dVar7);
  dVar8.e = iVar5;
  dVar8.f = uVar4;
  dVar8._12_4_ = 0;
  dVar8 = diyfp::normalize(dVar8);
  (__return_storage_ptr__->w).f = dVar8.f;
  (__return_storage_ptr__->w).e = dVar8.e;
  (__return_storage_ptr__->minus).f = lVar3 + -1 << ((char)iVar2 - (char)dVar7.e & 0x3fU);
  (__return_storage_ptr__->minus).e = dVar7.e;
  (__return_storage_ptr__->plus).f = dVar7.f;
  (__return_storage_ptr__->plus).e = dVar7.e;
  return __return_storage_ptr__;
}

Assistant:

Target reinterpret_bits(const Source source)
{
static_assert(sizeof(Target) == sizeof(Source), "size mismatch");

Target target;
std::memcpy(&target, &source, sizeof(Source));
return target;
}